

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::Clear(ImDrawList *this)

{
  ImDrawCmd *__src;
  unsigned_short *__src_00;
  ImDrawVert *__src_01;
  ImVec4 *__src_02;
  void **__src_03;
  ImVec2 *__src_04;
  ImDrawCmd *__dest;
  unsigned_short *__dest_00;
  ImDrawVert *__dest_01;
  ImVec4 *__dest_02;
  void **__dest_03;
  ImVec2 *__dest_04;
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar2 = (this->CmdBuffer).Capacity;
  if (iVar2 < 0) {
    uVar1 = iVar2 / 2 + iVar2;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    __dest = (ImDrawCmd *)ImGui::MemAlloc(uVar4 * 0x30);
    __src = (this->CmdBuffer).Data;
    if (__src != (ImDrawCmd *)0x0) {
      memcpy(__dest,__src,(long)(this->CmdBuffer).Size * 0x30);
      ImGui::MemFree((this->CmdBuffer).Data);
    }
    (this->CmdBuffer).Data = __dest;
    (this->CmdBuffer).Capacity = (int)uVar4;
  }
  (this->CmdBuffer).Size = 0;
  iVar2 = (this->IdxBuffer).Capacity;
  if (iVar2 < 0) {
    iVar2 = iVar2 / 2 + iVar2;
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    __dest_00 = (unsigned_short *)ImGui::MemAlloc((ulong)(uint)(iVar3 * 2));
    __src_00 = (this->IdxBuffer).Data;
    if (__src_00 != (unsigned_short *)0x0) {
      memcpy(__dest_00,__src_00,(long)(this->IdxBuffer).Size * 2);
      ImGui::MemFree((this->IdxBuffer).Data);
    }
    (this->IdxBuffer).Data = __dest_00;
    (this->IdxBuffer).Capacity = iVar3;
  }
  (this->IdxBuffer).Size = 0;
  iVar2 = (this->VtxBuffer).Capacity;
  if (iVar2 < 0) {
    uVar1 = iVar2 / 2 + iVar2;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    __dest_01 = (ImDrawVert *)ImGui::MemAlloc(uVar4 * 0x14);
    __src_01 = (this->VtxBuffer).Data;
    if (__src_01 != (ImDrawVert *)0x0) {
      memcpy(__dest_01,__src_01,(long)(this->VtxBuffer).Size * 0x14);
      ImGui::MemFree((this->VtxBuffer).Data);
    }
    (this->VtxBuffer).Data = __dest_01;
    (this->VtxBuffer).Capacity = (int)uVar4;
  }
  uVar4 = 0;
  (this->VtxBuffer).Size = 0;
  this->Flags = 3;
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  iVar2 = (this->_ClipRectStack).Capacity;
  if (iVar2 < 0) {
    uVar1 = iVar2 / 2 + iVar2;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    __dest_02 = (ImVec4 *)ImGui::MemAlloc(uVar4 << 4);
    __src_02 = (this->_ClipRectStack).Data;
    if (__src_02 != (ImVec4 *)0x0) {
      memcpy(__dest_02,__src_02,(long)(this->_ClipRectStack).Size << 4);
      ImGui::MemFree((this->_ClipRectStack).Data);
    }
    (this->_ClipRectStack).Data = __dest_02;
    (this->_ClipRectStack).Capacity = (int)uVar4;
  }
  (this->_ClipRectStack).Size = 0;
  iVar2 = (this->_TextureIdStack).Capacity;
  if (iVar2 < 0) {
    uVar1 = iVar2 / 2 + iVar2;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    __dest_03 = (void **)ImGui::MemAlloc(uVar4 * 8);
    __src_03 = (this->_TextureIdStack).Data;
    if (__src_03 != (void **)0x0) {
      memcpy(__dest_03,__src_03,(long)(this->_TextureIdStack).Size << 3);
      ImGui::MemFree((this->_TextureIdStack).Data);
    }
    (this->_TextureIdStack).Data = __dest_03;
    (this->_TextureIdStack).Capacity = (int)uVar4;
  }
  (this->_TextureIdStack).Size = 0;
  iVar2 = (this->_Path).Capacity;
  if (iVar2 < 0) {
    uVar1 = iVar2 / 2 + iVar2;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    __dest_04 = (ImVec2 *)ImGui::MemAlloc(uVar4 * 8);
    __src_04 = (this->_Path).Data;
    if (__src_04 != (ImVec2 *)0x0) {
      memcpy(__dest_04,__src_04,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = __dest_04;
    (this->_Path).Capacity = (int)uVar4;
  }
  (this->_Path).Size = 0;
  this->_ChannelsCurrent = 0;
  this->_ChannelsCount = 1;
  return;
}

Assistant:

void ImDrawList::Clear()
{
    CmdBuffer.resize(0);
    IdxBuffer.resize(0);
    VtxBuffer.resize(0);
    Flags = ImDrawListFlags_AntiAliasedLines | ImDrawListFlags_AntiAliasedFill;
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.resize(0);
    _TextureIdStack.resize(0);
    _Path.resize(0);
    _ChannelsCurrent = 0;
    _ChannelsCount = 1;
    // NB: Do not clear channels so our allocations are re-used after the first frame.
}